

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall spirv_cross::Compiler::reflection_ssbo_instance_name_is_significant(Compiler *this)

{
  uint uVar1;
  size_t sVar2;
  Variant *pVVar3;
  bool bVar4;
  SPIRVariable *pSVar5;
  SPIRType *pSVar6;
  const_iterator cVar7;
  byte bVar8;
  long lVar9;
  byte bVar10;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ssbo_type_ids;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_90;
  uint32_t local_84;
  LoopLock local_80;
  ParsedIR *local_78;
  TypedID<(spirv_cross::Types)0> *local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  if ((this->ir).source.known == true) {
    bVar8 = (this->ir).source.hlsl;
  }
  else {
    local_78 = &this->ir;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    ParsedIR::create_loop_hard_lock(local_78);
    sVar2 = (this->ir).ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar2 == 0) {
      bVar8 = 0;
    }
    else {
      local_70 = (this->ir).ids_for_type[2].
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar9 = 0;
      bVar10 = 0;
      do {
        uVar1 = *(uint *)((long)&local_70->id + lVar9);
        pVVar3 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
        bVar8 = bVar10;
        if (pVVar3[uVar1].type == TypeVariable) {
          pSVar5 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar1);
          pSVar6 = Variant::get<spirv_cross::SPIRType>
                             ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                              *(uint *)&(pSVar5->super_IVariant).field_0xc);
          if ((pSVar6->pointer == true) &&
             ((pSVar5->storage == StorageBuffer ||
              ((pSVar5->storage == StorageClassUniform &&
               (bVar4 = ParsedIR::has_decoration
                                  (local_78,(ID)(pSVar6->super_IVariant).self.id,BufferBlock), bVar4
               )))))) {
            local_90 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)CONCAT44(local_90._4_4_,(pSVar6->super_IVariant).self.id);
            cVar7 = ::std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&local_68,(key_type_conflict *)&local_90);
            bVar8 = 1;
            if (cVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
              local_84 = (pSVar6->super_IVariant).self.id;
              local_90 = &local_68;
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)local_90,&local_84,&local_90);
              bVar8 = bVar10;
            }
          }
        }
        lVar9 = lVar9 + 4;
        bVar10 = bVar8;
      } while (sVar2 << 2 != lVar9);
    }
    ParsedIR::LoopLock::~LoopLock(&local_80);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
  }
  return (bool)(bVar8 & 1);
}

Assistant:

bool Compiler::reflection_ssbo_instance_name_is_significant() const
{
	if (ir.source.known)
	{
		// UAVs from HLSL source tend to be declared in a way where the type is reused
		// but the instance name is significant, and that's the name we should report.
		// For GLSL, SSBOs each have their own block type as that's how GLSL is written.
		return ir.source.hlsl;
	}

	unordered_set<uint32_t> ssbo_type_ids;
	bool aliased_ssbo_types = false;

	// If we don't have any OpSource information, we need to perform some shaky heuristics.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if (!type.pointer || var.storage == StorageClassFunction)
			return;

		bool ssbo = var.storage == StorageClassStorageBuffer ||
		            (var.storage == StorageClassUniform && has_decoration(type.self, DecorationBufferBlock));

		if (ssbo)
		{
			if (ssbo_type_ids.count(type.self))
				aliased_ssbo_types = true;
			else
				ssbo_type_ids.insert(type.self);
		}
	});

	// If the block name is aliased, assume we have HLSL-style UAV declarations.
	return aliased_ssbo_types;
}